

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parentedentity.cpp
# Opt level: O0

void __thiscall
libcellml::ParentedEntity::ParentedEntityImpl::removeParent(ParentedEntityImpl *this)

{
  weak_ptr<libcellml::ParentedEntity> local_20;
  ParentedEntityImpl *local_10;
  ParentedEntityImpl *this_local;
  
  local_10 = this;
  memset(&local_20,0,0x10);
  std::weak_ptr<libcellml::ParentedEntity>::weak_ptr(&local_20);
  std::weak_ptr<libcellml::ParentedEntity>::operator=(&this->mParent,&local_20);
  std::weak_ptr<libcellml::ParentedEntity>::~weak_ptr(&local_20);
  return;
}

Assistant:

void ParentedEntity::ParentedEntityImpl::removeParent()
{
    mParent = {};
}